

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest42
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  string *psVar1;
  bool bVar2;
  Application *pAVar3;
  FieldBase *pFVar4;
  FieldBase *pFVar5;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  FieldBase local_188;
  FieldBase local_130;
  FieldBase local_d8;
  FieldBase local_80;
  
  pAVar3 = this;
  queryOrigClOrdID((OrigClOrdID *)&local_290,this);
  queryClOrdID((ClOrdID *)&local_130,pAVar3);
  pAVar3 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_238,0x15,'1');
  local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00161ea0;
  querySymbol((Symbol *)&local_188,pAVar3);
  querySide((Side *)&local_1e0,pAVar3);
  FIX::TransactTime::TransactTime((TransactTime *)&local_80);
  queryOrdType((OrdType *)&local_d8,pAVar3);
  FIX42::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)&local_290,(ClOrdID *)&local_130,
             (HandlInst *)&local_238,(Symbol *)&local_188,(Side *)&local_1e0,
             (TransactTime *)&local_80,(OrdType *)&local_d8);
  FIX::FieldBase::~FieldBase(&local_d8);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase(&local_130);
  FIX::FieldBase::~FieldBase(&local_290);
  psVar1 = &local_290.m_string;
  pFVar5 = &local_290;
  local_290._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pFVar5,"New price","");
  pFVar4 = &local_290;
  bVar2 = queryConfirm((Application *)pFVar5,(string *)pFVar4);
  if ((string *)local_290._vptr_FieldBase != psVar1) {
    pFVar4 = (FieldBase *)(local_290.m_string._M_dataplus._M_p + 1);
    operator_delete(local_290._vptr_FieldBase,(ulong)pFVar4);
  }
  if (bVar2) {
    queryPrice((Price *)&local_290,(Application *)pFVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_290,true);
    FIX::FieldBase::~FieldBase(&local_290);
  }
  pFVar5 = &local_290;
  local_290._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pFVar5,"New quantity","");
  pFVar4 = &local_290;
  bVar2 = queryConfirm((Application *)pFVar5,(string *)pFVar4);
  if ((string *)local_290._vptr_FieldBase != psVar1) {
    pFVar4 = (FieldBase *)(local_290.m_string._M_dataplus._M_p + 1);
    operator_delete(local_290._vptr_FieldBase,(ulong)pFVar4);
  }
  if (bVar2) {
    queryOrderQty((OrderQty *)&local_290,(Application *)pFVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_290,true);
    FIX::FieldBase::~FieldBase(&local_290);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX42::OrderCancelReplaceRequest Application::queryCancelReplaceRequest42() {
  FIX42::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      FIX::TransactTime(),
      queryOrdType());

  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}